

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
irwincolor::sortidx<double>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *v)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  long lVar1;
  uint uVar2;
  ulong uVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var4
  ;
  allocator_type local_21;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_21);
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar2 = 0;
    _Var4._M_current = __first._M_current;
    do {
      *_Var4._M_current = uVar2;
      uVar2 = uVar2 + 1;
      _Var4._M_current = _Var4._M_current + 1;
    } while (_Var4._M_current != __last._M_current);
    if (__first._M_current != __last._M_current) {
      uVar3 = (long)__last._M_current - (long)__first._M_current >> 2;
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<irwincolor::sortidx<double>(std::vector<double,std::allocator<double>>const&)::_lambda(unsigned_int,unsigned_int)_1_>>
                (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_JeffIrwin[P]maph_submodules_colormapper___sort_h:20:36)>
                  )v);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<irwincolor::sortidx<double>(std::vector<double,std::allocator<double>>const&)::_lambda(unsigned_int,unsigned_int)_1_>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_JeffIrwin[P]maph_submodules_colormapper___sort_h:20:36)>
                  )v);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> sortidx(const std::vector<T>& v)
{
	// Instead of sorting a vector v, sort an index array that gives
	// the ascending sorted values v[idx[0: ]].

	// initialize original index locations
	std::vector<unsigned int> idx(v.size());
	std::iota(idx.begin(), idx.end(), 0);

	// sort indices based on comparing values in v
	std::sort(idx.begin(), idx.end(), [&v](unsigned int i1, unsigned int i2) {return v[i1] < v[i2];});

	return idx;
}